

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string text;
  string local_3b8;
  stringstream strStream;
  ostream local_388 [376];
  ifstream inFile;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&inFile);
  std::ifstream::open((char *)&inFile,0x113110);
  std::__cxx11::stringstream::stringstream((stringstream *)&strStream);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  compile(&local_3b8,&text);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&text);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strStream);
  std::ifstream::~ifstream(&inFile);
  return 0;
}

Assistant:

int main() {
    ifstream inFile;
    inFile.open("yourinputfiledirectory");
    stringstream strStream;
    strStream << inFile.rdbuf();
    string text = strStream.str();
    compile(text);
    return 0;
}